

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::FileOutputStream
          (FileOutputStream *this,int file_descriptor,int block_size)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  CopyingFileOutputStream *in_RDI;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffe4;
  CopyingOutputStream *in_stack_ffffffffffffffe8;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream((ZeroCopyOutputStream *)in_RDI);
  (in_RDI->super_CopyingOutputStream)._vptr_CopyingOutputStream =
       (_func_int **)&PTR__FileOutputStream_00898a18;
  CopyingFileOutputStream::CopyingFileOutputStream(in_RDI,in_stack_ffffffffffffffcc);
  CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
            ((CopyingOutputStreamAdaptor *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4);
  return;
}

Assistant:

FileOutputStream::FileOutputStream(int file_descriptor, int block_size)
    : copying_output_(file_descriptor), impl_(&copying_output_, block_size) {}